

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

bool __thiscall
matchit::impl::Id<mathiu::impl::Difference>::matchValue<mathiu::impl::Difference_const&>
          (Id<mathiu::impl::Difference> *this,Difference *v)

{
  bool bVar1;
  ExprPtrArray<2UL> *l;
  BlockT *pBVar2;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    l = &internalValue(this)->super_ExprPtrArray<2>;
    bVar1 = mathiu::impl::operator==(l,&v->super_ExprPtrArray<2>);
    return bVar1;
  }
  pBVar2 = block(this);
  IdUtil<mathiu::impl::Difference>::bindValue<mathiu::impl::Difference_const&>
            (&(pBVar2->super_IdBlockBase<mathiu::impl::Difference>).mVariant,v);
  return true;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }